

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O0

int __thiscall
asl::Array<unsigned_char>::clone
          (Array<unsigned_char> *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  uchar *p;
  int n;
  Array<unsigned_char> *this_local;
  Array<unsigned_char> *b;
  
  p = *(uchar **)__fn;
  n = length((Array<unsigned_char> *)__fn);
  Array(this,p,n);
  return (int)this;
}

Assistant:

Array clone() const
	{
		Array b(_a, length());
		return b;
	}